

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhistory.cc
# Opt level: O2

bool __thiscall bdMsgHistoryList::canSend(bdMsgHistoryList *this)

{
  _Rb_tree_header *p_Var1;
  time_t tVar2;
  long lVar3;
  ostream *poVar4;
  bool bVar5;
  char *pcVar6;
  
  std::operator<<((ostream *)&std::cerr,"bdMsgHistoryList::canSend()");
  p_Var1 = &(this->msgHistory)._M_t._M_impl.super__Rb_tree_header;
  if (p_Var1 == (_Rb_tree_header *)
                (this->msgHistory)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
LAB_00117c71:
    if (((this->msgHistory)._M_t._M_impl.super__Rb_tree_header._M_node_count & 1) != 0) {
      std::operator<<((ostream *)&std::cerr," false");
      bVar5 = false;
      goto LAB_00117cce;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr," SIZE: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    pcVar6 = " % 2 = 0 ... true";
  }
  else {
    tVar2 = time((time_t *)0x0);
    lVar3 = std::_Rb_tree_decrement(&p_Var1->_M_header);
    if (tVar2 - *(long *)(lVar3 + 0x20) < 0x3d) goto LAB_00117c71;
    poVar4 = (ostream *)&std::cerr;
    pcVar6 = " OVER RESEND_PERIOD... true";
  }
  std::operator<<(poVar4,pcVar6);
  bVar5 = true;
LAB_00117cce:
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  return bVar5;
}

Assistant:

bool bdMsgHistoryList::canSend() {
	std::cerr << "bdMsgHistoryList::canSend()";

	std::multimap<time_t, bdMsgHistoryItem>::reverse_iterator rit;

	rit = msgHistory.rbegin();
	if (rit != msgHistory.rend()) {
		time_t now = time(NULL);
		if (now - rit->first > MIN_RESEND_PERIOD) {
			std::cerr << " OVER RESEND_PERIOD... true";
			std::cerr << std::endl;

			return true;
		}
	}

	if (msgHistory.size() % 2 == 0) {
		std::cerr << " SIZE: " << msgHistory.size() << " % 2 = 0 ... true";
		std::cerr << std::endl;

		return true;
	}

	std::cerr << " false";
	std::cerr << std::endl;

	return false;
}